

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O3

FT_Error TT_Load_Glyph_Header(TT_Loader loader)

{
  ushort *puVar1;
  FT_Error FVar2;
  
  puVar1 = (ushort *)loader->cursor;
  FVar2 = 0x14;
  if (puVar1 + 5 <= loader->limit) {
    loader->n_contours = *puVar1 << 8 | *puVar1 >> 8;
    (loader->bbox).xMin =
         (long)(short)((ushort)(byte)puVar1[1] << 8) | (ulong)*(byte *)((long)puVar1 + 3);
    (loader->bbox).yMin =
         (long)(short)((ushort)(byte)puVar1[2] << 8) | (ulong)*(byte *)((long)puVar1 + 5);
    (loader->bbox).xMax =
         (long)(short)((ushort)(byte)puVar1[3] << 8) | (ulong)*(byte *)((long)puVar1 + 7);
    (loader->bbox).yMax =
         (long)(short)((ushort)(byte)puVar1[4] << 8) | (ulong)*(byte *)((long)puVar1 + 9);
    loader->cursor = (FT_Byte *)(puVar1 + 5);
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Load_Glyph_Header( TT_Loader  loader )
  {
    FT_Byte*  p     = loader->cursor;
    FT_Byte*  limit = loader->limit;


    if ( p + 10 > limit )
      return FT_THROW( Invalid_Outline );

    loader->n_contours = FT_NEXT_SHORT( p );

    loader->bbox.xMin = FT_NEXT_SHORT( p );
    loader->bbox.yMin = FT_NEXT_SHORT( p );
    loader->bbox.xMax = FT_NEXT_SHORT( p );
    loader->bbox.yMax = FT_NEXT_SHORT( p );

    FT_TRACE5(( "  # of contours: %d\n", loader->n_contours ));
    FT_TRACE5(( "  xMin: %4d  xMax: %4d\n", loader->bbox.xMin,
                                            loader->bbox.xMax ));
    FT_TRACE5(( "  yMin: %4d  yMax: %4d\n", loader->bbox.yMin,
                                            loader->bbox.yMax ));
    loader->cursor = p;

    return FT_Err_Ok;
  }